

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

size_t vectorread32le<std::shared_ptr<ReadWriter>>
                 (shared_ptr<ReadWriter> *rd,DwordVector *v,size_t n)

{
  element_type *peVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,n);
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = (*peVar1->_vptr_ReadWriter[2])
                    (peVar1,(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start,n << 2);
  if ((uVar2 & 3) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (v,CONCAT44(extraout_var,uVar2) >> 2);
    return (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "read partial uint32_t";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

size_t vectorread32le(PTR rd, DwordVector& v, size_t n)
{
    v.resize(n);

    size_t nr= rd->read((uint8_t*)&v[0], n*sizeof(uint32_t));
    if (nr%sizeof(uint32_t))
        throw "read partial uint32_t";
    v.resize(nr/sizeof(uint32_t));
#if __BYTE_ORDER == __BIG_ENDIAN
#ifdef __GXX_EXPERIMENTAL_CXX0X__
    std::for_each(v.begin(), v.end(), [](uint32_t& x) { x= swab32(x);});
#else
    throw "need c++0x";
#endif
#endif
    return v.size();
}